

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::
SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
::
emplace_back<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
          (SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
           *this,tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                 *args)

{
  SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
  *pSVar1;
  SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
  *pSVar2;
  undefined8 *puVar3;
  ulong uVar4;
  SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
  *p;
  undefined8 uVar5;
  void *pvVar6;
  long lVar7;
  SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
  *pSVar8;
  long lVar9;
  ulong uVar10;
  
  pSVar8 = (SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
            *)(*(long *)(this + 8) * 0x18 + *(long *)this);
  if (*(long *)(this + 8) != *(long *)(this + 0x10)) {
    uVar5 = *(undefined8 *)
             ((long)&(args->
                     super__Tuple_impl<0UL,_const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                     ).
                     super__Tuple_impl<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                     .
                     super__Head_base<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>,_false>
                     ._M_head_impl.
                     super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                     .
                     super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                     .
                     super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
             + 8);
    *(undefined8 *)pSVar8 =
         *(undefined8 *)
          &(args->
           super__Tuple_impl<0UL,_const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
           ).
           super__Tuple_impl<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
           .
           super__Head_base<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>,_false>
           ._M_head_impl.
           super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
           .
           super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
           .
           super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
    ;
    *(undefined8 *)(pSVar8 + 8) = uVar5;
    *(Symbol **)(pSVar8 + 0x10) =
         (args->
         super__Tuple_impl<0UL,_const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
         ).super__Head_base<0UL,_const_slang::ast::Symbol_*,_false>._M_head_impl;
    lVar9 = *(long *)(this + 8);
    *(long *)(this + 8) = lVar9 + 1;
    return (reference)(lVar9 * 0x18 + *(long *)this);
  }
  if (*(long *)(this + 8) == 0x555555555555555) {
    detail::throwLengthError();
  }
  uVar10 = *(long *)(this + 8) + 1;
  uVar4 = *(ulong *)(this + 0x10);
  if (uVar10 < uVar4 * 2) {
    uVar10 = uVar4 * 2;
  }
  if (0x555555555555555 - uVar4 < uVar4) {
    uVar10 = 0x555555555555555;
  }
  lVar9 = (long)pSVar8 - *(long *)this;
  pvVar6 = operator_new(uVar10 * 0x18);
  uVar5 = *(undefined8 *)
           ((long)&(args->
                   super__Tuple_impl<0UL,_const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                   ).
                   super__Tuple_impl<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                   .
                   super__Head_base<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>,_false>
                   ._M_head_impl.
                   super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
           + 8);
  *(undefined8 *)((long)pvVar6 + lVar9) =
       *(undefined8 *)
        &(args->
         super__Tuple_impl<0UL,_const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
         ).
         super__Tuple_impl<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
         .
         super__Head_base<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>,_false>
         ._M_head_impl.
         super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
         .
         super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
         .
         super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
  ;
  ((undefined8 *)((long)pvVar6 + lVar9))[1] = uVar5;
  *(Symbol **)((long)pvVar6 + lVar9 + 0x10) =
       (args->
       super__Tuple_impl<0UL,_const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
       ).super__Head_base<0UL,_const_slang::ast::Symbol_*,_false>._M_head_impl;
  p = *(SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
        **)this;
  pSVar1 = p + *(long *)(this + 8) * 0x18;
  if (pSVar1 == pSVar8) {
    if (*(long *)(this + 8) != 0) {
      lVar7 = 0;
      do {
        pSVar8 = p + lVar7;
        uVar5 = *(undefined8 *)(pSVar8 + 8);
        *(undefined8 *)((long)pvVar6 + lVar7) = *(undefined8 *)pSVar8;
        ((undefined8 *)((long)pvVar6 + lVar7))[1] = uVar5;
        *(undefined8 *)((long)pvVar6 + lVar7 + 0x10) = *(undefined8 *)(pSVar8 + 0x10);
        lVar7 = lVar7 + 0x18;
      } while (pSVar8 + 0x18 != pSVar1);
    }
  }
  else {
    if (p != pSVar8) {
      lVar7 = 0;
      do {
        pSVar2 = p + lVar7;
        uVar5 = *(undefined8 *)(pSVar2 + 8);
        *(undefined8 *)((long)pvVar6 + lVar7) = *(undefined8 *)pSVar2;
        ((undefined8 *)((long)pvVar6 + lVar7))[1] = uVar5;
        *(undefined8 *)((long)pvVar6 + lVar7 + 0x10) = *(undefined8 *)(pSVar2 + 0x10);
        lVar7 = lVar7 + 0x18;
      } while (pSVar2 + 0x18 != pSVar8);
    }
    lVar7 = 0;
    do {
      pSVar2 = pSVar8 + lVar7;
      uVar5 = *(undefined8 *)(pSVar2 + 8);
      puVar3 = (undefined8 *)((long)pvVar6 + lVar7 + lVar9 + 0x18);
      *puVar3 = *(undefined8 *)pSVar2;
      puVar3[1] = uVar5;
      *(undefined8 *)((long)pvVar6 + lVar7 + lVar9 + 0x28) = *(undefined8 *)(pSVar2 + 0x10);
      lVar7 = lVar7 + 0x18;
    } while (pSVar2 + 0x18 != pSVar1);
  }
  if (p != this + 0x18) {
    operator_delete(p);
  }
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = uVar10;
  *(void **)this = pvVar6;
  return (reference)((long)pvVar6 + lVar9);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }